

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BroadcastReceiver.h
# Opt level: O1

void __thiscall
aeron::concurrent::broadcast::BroadcastReceiver::BroadcastReceiver
          (BroadcastReceiver *this,AtomicBuffer *buffer)

{
  long lVar1;
  length_t lVar2;
  int64_t iVar3;
  SourcedException *this_00;
  char *pcVar4;
  uint __val;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->m_buffer = buffer;
  lVar2 = buffer->m_length;
  __val = lVar2 - 0x80;
  lVar1 = (long)(int)lVar2 + -0x70;
  this->m_capacity = __val;
  this->m_mask = lVar2 - 0x81;
  this->m_tailIntentCounterIndex = __val;
  this->m_tailCounterIndex = lVar2 - 0x78;
  this->m_latestCounterIndex = (index_t)lVar1;
  *(undefined8 *)&this->m_recordOffset = 0;
  *(undefined8 *)((long)&this->m_cursor + 4) = 0;
  this->m_nextRecord = 0;
  (this->m_lappedCount).super___atomic_base<long>._M_i = 0;
  if ((0x80 < (long)(int)lVar2) && ((lVar2 + 0x7fffff7f & __val) == 0)) {
    iVar3 = *(int64_t *)(buffer->m_buffer + lVar1);
    this->m_cursor = iVar3;
    this->m_nextRecord = iVar3;
    this->m_recordOffset = lVar2 - 0x81 & (uint)iVar3;
    return;
  }
  this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_60,__val);
  std::operator+(&local_40,"capacity must be a positive power of 2 + TRAILER_LENGTH: capacity=",
                 &local_60);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,
             "void aeron::concurrent::broadcast::BroadcastBufferDescriptor::checkCapacity(util::index_t)"
             ,"");
  pcVar4 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/BroadcastBufferDescriptor.h"
                            );
  std::__cxx11::string::string((string *)&local_80,pcVar4,&local_a1);
  util::SourcedException::SourcedException(this_00,&local_40,&local_a0,&local_80,0x27);
  *(undefined ***)this_00 = &PTR__SourcedException_00164480;
  __cxa_throw(this_00,&util::IllegalStateException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

BroadcastReceiver(AtomicBuffer& buffer) :
        m_buffer(buffer),
        m_capacity(buffer.capacity() - BroadcastBufferDescriptor::TRAILER_LENGTH),
        m_mask(m_capacity - 1),
        m_tailIntentCounterIndex(m_capacity + BroadcastBufferDescriptor::TAIL_INTENT_COUNTER_OFFSET),
        m_tailCounterIndex(m_capacity + BroadcastBufferDescriptor::TAIL_COUNTER_OFFSET),
        m_latestCounterIndex(m_capacity + BroadcastBufferDescriptor::LATEST_COUNTER_OFFSET),
        m_recordOffset(0),
        m_cursor(0),
        m_nextRecord(0),
        m_lappedCount(0)
    {
        BroadcastBufferDescriptor::checkCapacity(m_capacity);

        m_cursor = m_buffer.getInt64(m_latestCounterIndex);
        m_nextRecord = m_cursor;
        m_recordOffset = (std::int32_t)m_cursor & m_mask;
    }